

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O1

int __kmp_api_omp_in_final(void)

{
  int iVar1;
  
  if (__kmp_init_parallel != 0) {
    iVar1 = __kmp_get_global_thread_id_reg();
    return (uint)((__kmp_threads[iVar1]->th).th_current_task)->td_flags >> 1 & 1;
  }
  return 0;
}

Assistant:

int FTN_STDCALL
xexpand(FTN_IN_FINAL)( void )
{
    #ifdef KMP_STUB
	return 0;   // TO DO: clarify whether it returns 1 or 0?
    #else
        if ( ! TCR_4(__kmp_init_parallel) ) {
            return 0;
        }
	return __kmp_entry_thread() -> th.th_current_task -> td_flags.final;
    #endif
}